

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
gl3cts::ClipDistance::Utility::Framebuffer::readPixels
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,Framebuffer *this)

{
  int iVar1;
  int iVar2;
  GLsizei GVar3;
  GLsizei GVar4;
  glReadPixelsFunc p_Var5;
  GLenum err;
  float *pfVar6;
  allocator<float> local_1a;
  undefined1 local_19;
  Framebuffer *local_18;
  Framebuffer *this_local;
  vector<float,_std::allocator<float>_> *pixels;
  
  local_19 = 0;
  iVar1 = this->m_size_x;
  iVar2 = this->m_size_y;
  local_18 = this;
  this_local = (Framebuffer *)__return_storage_ptr__;
  std::allocator<float>::allocator(&local_1a);
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(long)(iVar1 * iVar2),&local_1a);
  std::allocator<float>::~allocator(&local_1a);
  if ((0 < this->m_size_x) && (0 < this->m_size_y)) {
    p_Var5 = this->m_gl->readPixels;
    GVar3 = this->m_size_x;
    GVar4 = this->m_size_y;
    pfVar6 = std::vector<float,_std::allocator<float>_>::data(__return_storage_ptr__);
    (*p_Var5)(0,0,GVar3,GVar4,0x1903,0x1406,pfVar6);
    err = (*this->m_gl->getError)();
    glu::checkError(err,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x60f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<glw::GLfloat> gl3cts::ClipDistance::Utility::Framebuffer::readPixels()
{
	std::vector<glw::GLfloat> pixels(m_size_x * m_size_y);

	if ((m_size_x > 0) && (m_size_y > 0))
	{
		m_gl.readPixels(0, 0, m_size_x, m_size_y, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glReadPixels call failed.");
	}

	return pixels;
}